

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O3

bool __thiscall lzham::symbol_codec::put_bits_init(symbol_codec *this,uint expected_size)

{
  bool bVar1;
  
  this->m_bit_buf = 0;
  this->m_bit_count = 0x40;
  if ((this->m_output_buf).m_size != 0) {
    (this->m_output_buf).m_size = 0;
  }
  bVar1 = elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_output_buf,expected_size,true,1,(object_mover)0x0,
                     true);
  return bVar1;
}

Assistant:

bool symbol_codec::put_bits_init(uint expected_size)
   {
      m_bit_buf = 0;
      m_bit_count = cBitBufSize;

      m_output_buf.try_resize(0);
      if (!m_output_buf.try_reserve(expected_size))
         return false;

      return true;
   }